

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::internal::UnaryOpSquaredNorm::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,UnaryOpSquaredNorm *this,
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          *u,int param_2)

{
  size_type sVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *this_00;
  CoeffReturnType dataPtr;
  double *dataPtr_00;
  CwiseAbs2ReturnType local_130;
  ConstColwiseReturnType local_108;
  SumReturnType local_e0;
  Stride<0,_0> local_a2;
  undefined1 local_a0 [8];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  undefined1 local_78 [8];
  Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_> um;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> result;
  int param_2_local;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *u_local;
  UnaryOpSquaredNorm *this_local;
  
  result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = param_2;
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::size(u);
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,sVar1,&local_41);
  std::allocator<double>::~allocator(&local_41);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
            std::
            vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ::operator[](u,0);
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()(this_00,0,0)
  ;
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::size(u);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)&rm.field_0x1e);
  Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_> *)local_78,
             dataPtr,2,sVar1,(Stride<0,_0> *)&rm.field_0x1e);
  dataPtr_00 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)local_40);
  sVar1 = std::
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          ::size(u);
  Eigen::Stride<0,_0>::Stride(&local_a2);
  Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_a0,
             dataPtr_00,1,sVar1,&local_a2);
  Eigen::
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  cwiseAbs2(&local_130,
            (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)local_78);
  Eigen::
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
  ::colwise(&local_108,
            (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
             *)&local_130);
  Eigen::
  VectorwiseOp<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  ::sum(&local_e0,&local_108);
  Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>> *)local_a0,
             (DenseBase<Eigen::PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::member_sum<double,_double>,_0>_>
              *)&local_e0);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_40);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    std::vector<double> result(u.size());
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {  // NOLINT
      static_assert(
          R > 0 && C > 0,
          "squaredNorm only supported for matrices with at least 1 row "
          "and column");
      if constexpr (C == 1) {  // NOLINT
        const Eigen::Map<const Eigen::Matrix<S, R, Eigen::Dynamic>> um(
            &u[0](0, 0), R, u.size());
        Eigen::Map<Eigen::Matrix<S, 1, Eigen::Dynamic>> rm(result.data(), 1,
                                                           u.size());
        rm = um.cwiseAbs2().colwise().sum();
      } else if constexpr (R == 1) {  // NOLINT
        Eigen::Map<const Eigen::Matrix<S, Eigen::Dynamic, C, Eigen::RowMajor>>
            um(&u[0](0, 0), u.size(), C);
        Eigen::Map<Eigen::Matrix<S, Eigen::Dynamic, 1>> rm(result.data(),
                                                           u.size(), 1);
        rm = um.cwiseAbs2().rowwise().sum();
      }
    } else {  // NOLINT
      for (std::size_t i = 0; i < u.size(); ++i) {
        result[i] = u[i].squaredNorm();
      }
    }
    return result;
  }